

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O3

void __thiscall Args::Arg::~Arg(Arg *this)

{
  ~Arg(this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

inline
Arg::~Arg()
{
}